

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::Texture3D::Texture3D(Texture3D *this,TextureFormat *format,int width,int height,int depth)

{
  int iVar1;
  ConstPixelBufferAccess *levels;
  int depth_local;
  int height_local;
  int width_local;
  TextureFormat *format_local;
  Texture3D *this_local;
  
  iVar1 = computeMipPyramidLevels(width,height,depth);
  TextureLevelPyramid::TextureLevelPyramid(&this->super_TextureLevelPyramid,format,iVar1);
  this->m_width = width;
  this->m_height = height;
  this->m_depth = depth;
  iVar1 = TextureLevelPyramid::getNumLevels(&this->super_TextureLevelPyramid);
  levels = &TextureLevelPyramid::getLevels(&this->super_TextureLevelPyramid)->
            super_ConstPixelBufferAccess;
  Texture3DView::Texture3DView(&this->m_view,iVar1,levels);
  return;
}

Assistant:

Texture3D::Texture3D (const TextureFormat& format, int width, int height, int depth)
	: TextureLevelPyramid	(format, computeMipPyramidLevels(width, height, depth))
	, m_width				(width)
	, m_height				(height)
	, m_depth				(depth)
	, m_view				(getNumLevels(), getLevels())
{
}